

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_texteditor(_glist *x)

{
  _rtext *x_00;
  ulong uVar1;
  int bufsize;
  char *buf;
  uint local_1c;
  char *local_18;
  
  x_00 = x->gl_editor->e_textedfor;
  if (x_00 == (_rtext *)0x0) {
    local_18 = "";
    local_1c = 0;
    uVar1 = 0;
  }
  else {
    rtext_gettext(x_00,&local_18,(int *)&local_1c);
    uVar1 = (ulong)local_1c;
  }
  pdgui_vmess("pdtk_pd_texteditor","p",uVar1,local_18);
  return;
}

Assistant:

static void canvas_texteditor(t_canvas *x)
{
    t_rtext *foo;
    char *buf;
    int bufsize;
    if ((foo = x->gl_editor->e_textedfor))
        rtext_gettext(foo, &buf, &bufsize);
    else buf = "", bufsize = 0;
    pdgui_vmess("pdtk_pd_texteditor", "p", bufsize, buf);
}